

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

void Curl_ssl_scache_destroy(Curl_ssl_scache *scache)

{
  ulong local_18;
  size_t i;
  Curl_ssl_scache *scache_local;
  
  if (((scache != (Curl_ssl_scache *)0x0) && (scache != (Curl_ssl_scache *)0x0)) &&
     (scache->magic == 0xe1551)) {
    scache->magic = 0;
    for (local_18 = 0; local_18 < scache->peer_count; local_18 = local_18 + 1) {
      cf_ssl_scache_clear_peer(scache->peers + local_18);
    }
    (*Curl_cfree)(scache->peers);
    (*Curl_cfree)(scache);
  }
  return;
}

Assistant:

void Curl_ssl_scache_destroy(struct Curl_ssl_scache *scache)
{
  if(scache && GOOD_SCACHE(scache)) {
    size_t i;
    scache->magic = 0;
    for(i = 0; i < scache->peer_count; ++i) {
      cf_ssl_scache_clear_peer(&scache->peers[i]);
    }
    free(scache->peers);
    free(scache);
  }
}